

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

int replay_match_victim_pedigree_internal(__cilkrts_worker *w,__cilkrts_worker *victim)

{
  bool bVar1;
  replay_entry_t *prVar2;
  long in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  bVar1 = replay_entry_t::match
                    (*(replay_entry_t **)(*(long *)(in_RDI + 0x38) + 0x1c0),ped_type_steal,
                     (__cilkrts_pedigree *)(**(long **)(in_RSI + 8) + 0x50),*(int *)(in_RSI + 0x28))
  ;
  if (bVar1) {
    prVar2 = replay_entry_t::next_entry(*(replay_entry_t **)(*(long *)(in_RDI + 0x38) + 0x1c0));
    *(replay_entry_t **)(*(long *)(in_RDI + 0x38) + 0x1c0) = prVar2;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int replay_match_victim_pedigree_internal(__cilkrts_worker *w, __cilkrts_worker *victim)
{
    // If we don't have a match, return 0
    if (! w->l->replay_list_entry->match(ped_type_steal,
                                             &((*victim->head)->parent_pedigree),
                                             victim->self))
        return 0;

    // Consume this entry
    w->l->replay_list_entry = w->l->replay_list_entry->next_entry();

    // Return success
    return 1;
}